

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecdh_exch.c
# Opt level: O0

void * ecdh_dupctx(void *vpecdhctx)

{
  int iVar1;
  EVP_MD *md;
  _func_int_EVP_MD_CTX_ptr_void_ptr_size_t *p_Var2;
  char *in_RDI;
  PROV_ECDH_CTX *dstctx;
  PROV_ECDH_CTX *srcctx;
  undefined8 in_stack_ffffffffffffffe0;
  int line;
  char *num;
  void *in_stack_fffffffffffffff8;
  
  line = (int)((ulong)in_stack_ffffffffffffffe0 >> 0x20);
  num = in_RDI;
  iVar1 = ossl_prov_is_running();
  if ((iVar1 != 0) && (md = (EVP_MD *)CRYPTO_zalloc((size_t)num,in_RDI,line), md != (EVP_MD *)0x0))
  {
    memcpy(md,in_RDI,0x40);
    *(undefined8 *)&md->md_size = 0;
    md->flags = 0;
    md->init = (_func_int_EVP_MD_CTX_ptr *)0x0;
    md->update = (_func_int_EVP_MD_CTX_ptr_void_ptr_size_t *)0x0;
    if ((((*(long *)(in_RDI + 8) == 0) ||
         (iVar1 = EC_KEY_up_ref(*(EC_KEY **)(in_RDI + 8)), iVar1 != 0)) &&
        ((*(undefined8 *)&md->md_size = *(undefined8 *)(in_RDI + 8), *(long *)(in_RDI + 0x10) == 0
         || (iVar1 = EC_KEY_up_ref(*(EC_KEY **)(in_RDI + 0x10)), iVar1 != 0)))) &&
       ((md->flags = *(unsigned_long *)(in_RDI + 0x10), *(long *)(in_RDI + 0x20) == 0 ||
        (iVar1 = EVP_MD_up_ref(md), iVar1 != 0)))) {
      md->init = *(_func_int_EVP_MD_CTX_ptr **)(in_RDI + 0x20);
      if (*(long *)(in_RDI + 0x28) == 0) {
        return md;
      }
      if (*(long *)(in_RDI + 0x30) == 0) {
        return md;
      }
      p_Var2 = (_func_int_EVP_MD_CTX_ptr_void_ptr_size_t *)
               CRYPTO_memdup(in_stack_fffffffffffffff8,(size_t)num,in_RDI,(int)((ulong)md >> 0x20));
      md->update = p_Var2;
      if (md->update != (_func_int_EVP_MD_CTX_ptr_void_ptr_size_t *)0x0) {
        return md;
      }
    }
    ecdh_freectx(md);
  }
  return (void *)0x0;
}

Assistant:

static
void *ecdh_dupctx(void *vpecdhctx)
{
    PROV_ECDH_CTX *srcctx = (PROV_ECDH_CTX *)vpecdhctx;
    PROV_ECDH_CTX *dstctx;

    if (!ossl_prov_is_running())
        return NULL;

    dstctx = OPENSSL_zalloc(sizeof(*srcctx));
    if (dstctx == NULL)
        return NULL;

    *dstctx = *srcctx;

    /* clear all pointers */

    dstctx->k= NULL;
    dstctx->peerk = NULL;
    dstctx->kdf_md = NULL;
    dstctx->kdf_ukm = NULL;

    /* up-ref all ref-counted objects referenced in dstctx */

    if (srcctx->k != NULL && !EC_KEY_up_ref(srcctx->k))
        goto err;
    else
        dstctx->k = srcctx->k;

    if (srcctx->peerk != NULL && !EC_KEY_up_ref(srcctx->peerk))
        goto err;
    else
        dstctx->peerk = srcctx->peerk;

    if (srcctx->kdf_md != NULL && !EVP_MD_up_ref(srcctx->kdf_md))
        goto err;
    else
        dstctx->kdf_md = srcctx->kdf_md;

    /* Duplicate UKM data if present */
    if (srcctx->kdf_ukm != NULL && srcctx->kdf_ukmlen > 0) {
        dstctx->kdf_ukm = OPENSSL_memdup(srcctx->kdf_ukm,
                                         srcctx->kdf_ukmlen);
        if (dstctx->kdf_ukm == NULL)
            goto err;
    }

    return dstctx;

 err:
    ecdh_freectx(dstctx);
    return NULL;
}